

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::BlockEventListControl::Event>::
emplaceRealloc<slang::ast::BlockEventListControl::Event>
          (SmallVectorBase<slang::ast::BlockEventListControl::Event> *this,pointer pos,Event *args)

{
  ulong uVar1;
  pointer p;
  undefined8 uVar2;
  bool bVar3;
  undefined7 uVar4;
  pointer pEVar5;
  pointer pEVar6;
  pointer pEVar7;
  long lVar8;
  long lVar9;
  size_type sVar10;
  ulong uVar11;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar1 = this->cap;
  if (uVar11 < uVar1 * 2) {
    uVar11 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pEVar5 = (pointer)operator_new(uVar11 << 4);
  uVar2 = *(undefined8 *)&args->isBegin;
  *(undefined8 *)((long)pEVar5 + lVar9) = args->target;
  ((undefined8 *)((long)pEVar5 + lVar9))[1] = uVar2;
  p = this->data_;
  sVar10 = this->len;
  lVar8 = (long)p + (sVar10 * 0x10 - (long)pos);
  pEVar6 = p;
  pEVar7 = pEVar5;
  if (lVar8 == 0) {
    pEVar6 = pEVar5;
    pEVar7 = p;
    if (sVar10 != 0) {
      do {
        bVar3 = pEVar7->isBegin;
        uVar4 = *(undefined7 *)&pEVar7->field_0x9;
        pEVar6->target = pEVar7->target;
        pEVar6->isBegin = bVar3;
        *(undefined7 *)&pEVar6->field_0x9 = uVar4;
        pEVar7 = pEVar7 + 1;
        pEVar6 = pEVar6 + 1;
      } while (pEVar7 != pos);
    }
  }
  else {
    for (; pEVar6 != pos; pEVar6 = pEVar6 + 1) {
      bVar3 = pEVar6->isBegin;
      uVar4 = *(undefined7 *)&pEVar6->field_0x9;
      pEVar7->target = pEVar6->target;
      pEVar7->isBegin = bVar3;
      *(undefined7 *)&pEVar7->field_0x9 = uVar4;
      pEVar7 = pEVar7 + 1;
    }
    memcpy((void *)((long)pEVar5 + lVar9 + 0x10),pos,(lVar8 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar10 = this->len;
  }
  this->len = sVar10 + 1;
  this->cap = uVar11;
  this->data_ = pEVar5;
  return (pointer)((long)pEVar5 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}